

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

void __thiscall
vkb::detail::VulkanFunctions::load_func<void(*(*)(VkInstance_T*,char_const*))()>
          (VulkanFunctions *this,_func__func_void_ptr_VkInstance_T_ptr_char_ptr **func_dest,
          char *func_name)

{
  _func__func_void_ptr_VkInstance_T_ptr_char_ptr *p_Var1;
  char *func_name_local;
  _func__func_void_ptr_VkInstance_T_ptr_char_ptr **func_dest_local;
  VulkanFunctions *this_local;
  
  p_Var1 = (_func__func_void_ptr_VkInstance_T_ptr_char_ptr *)dlsym(this->library,func_name);
  *func_dest = p_Var1;
  return;
}

Assistant:

void load_func(T& func_dest, const char* func_name) {
#if defined(__linux__) || defined(__APPLE__) || defined(__FreeBSD__)
        func_dest = reinterpret_cast<T>(dlsym(library, func_name));
#elif defined(_WIN32)
        // GetProcAddress returns FARPROC, so need to cast it into a void* which can safely be cast to T
        func_dest = reinterpret_cast<T>(reinterpret_cast<void*>(GetProcAddress(library, func_name)));
#endif
    }